

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O2

void __thiscall CodeGenerator::writeReplicators(CodeGenerator *this,ostream *s,Class *clazz)

{
  pointer pRVar1;
  string *psVar2;
  ostream *poVar3;
  iterator iVar4;
  Replicator *r;
  pointer pRVar5;
  
  poVar3 = std::operator<<(s,"    // replicators");
  std::endl<char,std::char_traits<char>>(poVar3);
  pRVar5 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar1 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pRVar5 == pRVar1) {
      poVar3 = std::operator<<(s,"    void initReplicators(rengine::ResourceManager *manager) {");
      std::endl<char,std::char_traits<char>>(poVar3);
      pRVar1 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pRVar5 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>
                    ._M_impl.super__Vector_impl_data._M_start; pRVar5 != pRVar1; pRVar5 = pRVar5 + 1
          ) {
        poVar3 = std::operator<<(s,"        ");
        poVar3 = std::operator<<(poVar3,(string *)pRVar5);
        poVar3 = std::operator<<(poVar3,".resourceManager = manager;");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<(poVar3,"        ");
        poVar3 = std::operator<<(poVar3,(string *)pRVar5);
        poVar3 = std::operator<<(poVar3,".context = this;");
        poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<(poVar3,"        ");
        poVar3 = std::operator<<(poVar3,(string *)pRVar5);
        std::operator<<(poVar3,".setCount(");
        poVar3 = std::ostream::_M_insert<double>((pRVar5->count).numberValue);
        poVar3 = std::operator<<(poVar3,");");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      poVar3 = std::operator<<(s,"    }");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::endl<char,std::char_traits<char>>(s);
      return;
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                    *)this,&pRVar5->clazz);
    if ((_Rb_tree_header *)iVar4._M_node == &(this->m_classes)._M_t._M_impl.super__Rb_tree_header)
    break;
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                    *)this,&pRVar5->clazz);
    psVar2 = *(string **)(iVar4._M_node + 2);
    poVar3 = std::operator<<(s,"    struct Replicator_");
    poVar3 = std::operator<<(poVar3,(string *)pRVar5);
    poVar3 = std::operator<<(poVar3," : public rengine::Replicator<");
    poVar3 = std::operator<<(poVar3,psVar2);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,(string *)clazz);
    poVar3 = std::operator<<(poVar3,"> {");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"        rengine::ResourceManager *resourceManager;");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"        ");
    poVar3 = std::operator<<(poVar3,(string *)clazz);
    poVar3 = std::operator<<(poVar3," *context;");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"        ");
    poVar3 = std::operator<<(poVar3,psVar2);
    poVar3 = std::operator<<(poVar3," *onCreateInstance(unsigned index, unsigned count) {");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"            ");
    poVar3 = std::operator<<(poVar3,psVar2);
    poVar3 = std::operator<<(poVar3," *instance = new ");
    poVar3 = std::operator<<(poVar3,psVar2);
    poVar3 = std::operator<<(poVar3,"();");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"            instance->initialize(resourceManager);");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"            ");
    poVar3 = std::operator<<(poVar3,(string *)&pRVar5->initializor);
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"            context->");
    poVar3 = std::operator<<(poVar3,(string *)&pRVar5->parentId);
    poVar3 = std::operator<<(poVar3,"->append(instance->");
    poVar3 = std::operator<<(poVar3,(string *)(*(long *)(psVar2 + 0xd8) + 0x10));
    poVar3 = std::operator<<(poVar3,");");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"            return instance;");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"        }");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"        void onDestroyInstance(");
    poVar3 = std::operator<<(poVar3,psVar2);
    poVar3 = std::operator<<(poVar3," *instance) {");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"            delete instance;");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"        }");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"    } ");
    poVar3 = std::operator<<(poVar3,(string *)pRVar5);
    poVar3 = std::operator<<(poVar3,";");
    std::endl<char,std::char_traits<char>>(poVar3);
    pRVar5 = pRVar5 + 1;
  }
  __assert_fail("m_classes.find(r.clazz) != m_classes.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/src/renginec/codegenerator.h"
                ,0x185,"void CodeGenerator::writeReplicators(std::ostream &, Class *)");
}

Assistant:

void CodeGenerator::writeReplicators(std::ostream &s, Class *clazz)
{
    s << "    // replicators" << std::endl;

    // ### this only supports replecating other generated classes..
    for (const Replicator &r : clazz->replicators) {
        assert(m_classes.find(r.clazz) != m_classes.end());
        Class *instanceClass = m_classes.find(r.clazz)->second;
        s << "    struct Replicator_" << r.id << " : public rengine::Replicator<" << instanceClass->name << ", " << clazz->name << "> {" << std::endl
          << "        rengine::ResourceManager *resourceManager;" << std::endl
          << "        " << clazz->name << " *context;" << std::endl
          << "        " << instanceClass->name << " *onCreateInstance(unsigned index, unsigned count) {" << std::endl
          << "            " << instanceClass->name << " *instance = new " << instanceClass->name << "();" << std::endl
          << "            instance->initialize(resourceManager);" << std::endl
          << "            " << r.initializor << std::endl
          << "            context->" << r.parentId << "->append(instance->" << instanceClass->root->id << ");" << std::endl
          << "            return instance;" << std::endl
          << "        }" << std::endl
          << "        void onDestroyInstance(" << instanceClass->name << " *instance) {" << std::endl
          << "            delete instance;" << std::endl
          << "        }" << std::endl
          << "    } " << r.id << ";" << std::endl;
    }

    s << "    void initReplicators(rengine::ResourceManager *manager) {" << std::endl;
    for (const Replicator &r : clazz->replicators) {
        s << "        " << r.id << ".resourceManager = manager;" << std::endl
          << "        " << r.id << ".context = this;" << std::endl
          << "        " << r.id << ".setCount(" << r.count.numberValue << ");" << std::endl;
      }
    s << "    }" << std::endl;

    s << std::endl;
}